

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Name> *
wasm::WATParser::tableidx<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  __index_type *__rhs;
  undefined8 uVar1;
  __index_type *p_Var2;
  string local_b0 [32];
  string local_90;
  undefined1 local_70 [8];
  MaybeResult<wasm::Name> _val;
  MaybeResult<wasm::Name> idx;
  
  maybeTableidx<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),ctx);
  if (idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"expected table index or identifier",(allocator<char> *)local_70)
    ;
    Lexer::err((Err *)((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),
               &ctx->in,&local_90);
    std::__detail::__variant::_Variant_storage<false,wasm::Name,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Name,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    __rhs = (__index_type *)
            ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_70,
                    (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)__rhs);
    if (_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string(local_b0,(string *)local_70);
      std::__detail::__variant::_Variant_storage<false,wasm::Name,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Name,wasm::Err> *)__return_storage_ptr__,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_70);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_70);
      p_Var2 = (__index_type *)0x0;
      if (idx.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var2 = __rhs;
      }
      uVar1 = *(undefined8 *)(p_Var2 + 8);
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err> = *(undefined8 *)p_Var2;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 8) = uVar1;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableIdxT> tableidx(Ctx& ctx) {
  if (auto idx = maybeTableidx(ctx)) {
    CHECK_ERR(idx);
    return *idx;
  }
  return ctx.in.err("expected table index or identifier");
}